

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O1

char * duckdb::Highlighting::GetColorOption(char *option)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined1 *puVar4;
  
  iVar2 = strcmp("red",option);
  if (iVar2 == 0) {
    puVar4 = terminal_colors;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0xf0) {
        return (char *)0x0;
      }
      iVar2 = strcmp(*(char **)(terminal_colors + lVar3 + 0x10),option);
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    puVar4 = (undefined1 *)(lVar3 + 0x1998d20);
  }
  return *(char **)(puVar4 + 8);
}

Assistant:

const char *Highlighting::GetColorOption(const char *option) {
	size_t index = 0;
	while (terminal_colors[index].color_name) {
		if (strcmp(terminal_colors[index].color_name, option) == 0) {
			return terminal_colors[index].highlight;
		}
		index++;
	}
	return nullptr;
}